

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O3

Namespace * __thiscall
luabridge::Namespace::addVariable<int>(Namespace *this,char *name,int *value,bool isWritable)

{
  lua_State *L;
  int iVar1;
  logic_error *this_00;
  code *fn;
  
  if ((this->super_Registrar).m_stackSize == 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"addProperty () called on global namespace");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar1 = lua_type((this->super_Registrar).L,-1);
  if (iVar1 == 5) {
    lua_pushlightuserdata((this->super_Registrar).L,value);
    lua_pushcclosure((this->super_Registrar).L,detail::CFunc::getVariable<int>,1);
    detail::CFunc::addGetter((this->super_Registrar).L,name,-2);
    L = (this->super_Registrar).L;
    if (isWritable) {
      lua_pushlightuserdata(L,value);
      fn = detail::CFunc::setVariable<int>;
    }
    else {
      lua_pushstring(L,name);
      fn = detail::CFunc::readOnlyError;
    }
    lua_pushcclosure((this->super_Registrar).L,fn,1);
    detail::CFunc::addSetter((this->super_Registrar).L,name,-2);
    return this;
  }
  __assert_fail("lua_istable(L, -1)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                ,0x47c,
                "Namespace &luabridge::Namespace::addVariable(const char *, T *, bool) [T = int]");
}

Assistant:

Namespace& addVariable(char const* name, T* value, bool isWritable = true)
    {
        if (m_stackSize == 1)
        {
            throw std::logic_error("addProperty () called on global namespace");
        }

        assert(lua_istable(L, -1)); // Stack: namespace table (ns)

        lua_pushlightuserdata(L, value); // Stack: ns, pointer
        lua_pushcclosure(L, &CFunc::getVariable<T>, 1); // Stack: ns, getter
        CFunc::addGetter(L, name, -2); // Stack: ns

        if (isWritable)
        {
            lua_pushlightuserdata(L, value); // Stack: ns, pointer
            lua_pushcclosure(L, &CFunc::setVariable<T>, 1); // Stack: ns, setter
        }
        else
        {
            lua_pushstring(L, name); // Stack: ns, ps, name
            lua_pushcclosure(L, &CFunc::readOnlyError, 1); // Stack: ns, error_fn
        }
        CFunc::addSetter(L, name, -2); // Stack: ns

        return *this;
    }